

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall re2::Regexp::ParseState::PushRegexp(ParseState *this,Regexp *re)

{
  CharClassBuilder *pCVar1;
  byte bVar2;
  bool bVar3;
  _Rb_tree_color _Var4;
  
  MaybeConcatString(this,-1,NoParseFlags);
  bVar2 = re->op_;
  if (bVar2 != 0x14) goto LAB_00232542;
  pCVar1 = (re->field_7).field_3.ccb_;
  if (pCVar1 != (CharClassBuilder *)0x0) {
    CharClassBuilder::RemoveAbove(pCVar1,this->rune_max_);
    pCVar1 = (re->field_7).field_3.ccb_;
    if (pCVar1->nrunes_ == 2) {
      _Var4 = (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      if (_Var4 - 0x41 < 0x1a) {
        _Var4 = _Var4 | 0x20;
        bVar3 = CharClassBuilder::Contains(pCVar1,_Var4);
        if (bVar3) {
          Decref(re);
          re = (Regexp *)operator_new(0x28);
          Regexp(re,kRegexpLiteral,this->flags_ | FoldCase);
          goto LAB_002324ef;
        }
      }
    }
    else if (pCVar1->nrunes_ == 1) {
      _Var4 = (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      Decref(re);
      re = (Regexp *)operator_new(0x28);
      Regexp(re,kRegexpLiteral,this->flags_);
LAB_002324ef:
      (re->field_7).field_0.max_ = _Var4;
    }
  }
  bVar2 = re->op_;
LAB_00232542:
  if (bVar2 < 0x16) {
    bVar3 = ComputeSimple(re);
    re->simple_ = bVar3;
  }
  re->down_ = this->stacktop_;
  this->stacktop_ = re;
  return true;
}

Assistant:

bool Regexp::ParseState::PushRegexp(Regexp* re) {
  MaybeConcatString(-1, NoParseFlags);

  // Special case: a character class of one character is just
  // a literal.  This is a common idiom for escaping
  // single characters (e.g., [.] instead of \.), and some
  // analysis does better with fewer character classes.
  // Similarly, [Aa] can be rewritten as a literal A with ASCII case folding.
  if (re->op_ == kRegexpCharClass && re->ccb_ != NULL) {
    re->ccb_->RemoveAbove(rune_max_);
    if (re->ccb_->size() == 1) {
      Rune r = re->ccb_->begin()->lo;
      re->Decref();
      re = new Regexp(kRegexpLiteral, flags_);
      re->rune_ = r;
    } else if (re->ccb_->size() == 2) {
      Rune r = re->ccb_->begin()->lo;
      if ('A' <= r && r <= 'Z' && re->ccb_->Contains(r + 'a' - 'A')) {
        re->Decref();
        re = new Regexp(kRegexpLiteral, flags_ | FoldCase);
        re->rune_ = r + 'a' - 'A';
      }
    }
  }

  if (!IsMarker(re->op()))
    re->simple_ = re->ComputeSimple();
  re->down_ = stacktop_;
  stacktop_ = re;
  return true;
}